

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O0

GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
 BCL::
 local_malloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
           (size_t size)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  ulong uVar4;
  size_t sVar5;
  long *plVar6;
  chunk_t *free_chunk;
  char *allocd;
  chunk_t *chunk;
  size_t size_local;
  
  if ((bcl_finalized & 1) == 0) {
    std::mutex::lock((mutex *)malloc_mutex);
    puVar3 = smem_heap;
    uVar4 = size * 0x20 + 0x3f & 0xffffffffffffffc0;
    for (allocd = (char *)flist; (allocd != (char *)0x0 && (*(ulong *)allocd < uVar4));
        allocd = *(char **)(allocd + 0x10)) {
    }
    if ((allocd == (char *)0x0) || (*(ulong *)allocd < uVar4)) {
      *smem_heap = uVar4;
      puVar3[2] = 0;
      puVar3[1] = 0;
      sVar5 = chunk_t_size();
      free_chunk = (chunk_t *)((long)puVar3 + sVar5);
      if ((ulong)(smem_base_ptr + shared_segment_size) < (long)&free_chunk->size + uVar4) {
        std::mutex::unlock((mutex *)malloc_mutex);
        GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
        ::GlobalPtr((GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                     *)&size_local,(nullptr_t)0x0);
        return _size_local;
      }
      smem_heap = (ulong *)((long)&free_chunk->size + uVar4);
    }
    else {
      uVar1 = *(ulong *)allocd;
      sVar5 = chunk_t_size();
      if (uVar4 + 0x40 + sVar5 < uVar1) {
        sVar5 = chunk_t_size();
        plVar6 = (long *)(allocd + uVar4 + sVar5);
        lVar2 = *(long *)allocd;
        sVar5 = chunk_t_size();
        *plVar6 = (lVar2 - uVar4) - sVar5;
        plVar6[1] = *(long *)(allocd + 8);
        plVar6[2] = *(long *)(allocd + 0x10);
        if (*(long *)(allocd + 8) != 0) {
          *(long **)(*(long *)(allocd + 8) + 0x10) = plVar6;
        }
        if (*(long *)(allocd + 0x10) != 0) {
          *(long **)(*(long *)(allocd + 0x10) + 8) = plVar6;
        }
        *(ulong *)allocd = uVar4;
        allocd[0x10] = '\0';
        allocd[0x11] = '\0';
        allocd[0x12] = '\0';
        allocd[0x13] = '\0';
        allocd[0x14] = '\0';
        allocd[0x15] = '\0';
        allocd[0x16] = '\0';
        allocd[0x17] = '\0';
        allocd[8] = '\0';
        allocd[9] = '\0';
        allocd[10] = '\0';
        allocd[0xb] = '\0';
        allocd[0xc] = '\0';
        allocd[0xd] = '\0';
        allocd[0xe] = '\0';
        allocd[0xf] = '\0';
        if ((long *)allocd == flist) {
          flist = plVar6;
        }
      }
      else {
        if (*(long *)(allocd + 8) != 0) {
          *(undefined8 *)(*(long *)(allocd + 8) + 0x10) = *(undefined8 *)(allocd + 0x10);
        }
        if (*(long *)(allocd + 0x10) != 0) {
          *(undefined8 *)(*(long *)(allocd + 0x10) + 8) = *(undefined8 *)(allocd + 8);
        }
        if ((long *)allocd == flist) {
          flist = *(long **)(allocd + 0x10);
        }
        allocd[8] = '\0';
        allocd[9] = '\0';
        allocd[10] = '\0';
        allocd[0xb] = '\0';
        allocd[0xc] = '\0';
        allocd[0xd] = '\0';
        allocd[0xe] = '\0';
        allocd[0xf] = '\0';
        allocd[0x10] = '\0';
        allocd[0x11] = '\0';
        allocd[0x12] = '\0';
        allocd[0x13] = '\0';
        allocd[0x14] = '\0';
        allocd[0x15] = '\0';
        allocd[0x16] = '\0';
        allocd[0x17] = '\0';
      }
      sVar5 = chunk_t_size();
      free_chunk = (chunk_t *)(allocd + sVar5);
    }
    std::mutex::unlock((mutex *)malloc_mutex);
    sVar5 = rank();
    GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
    ::GlobalPtr((GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                 *)&size_local,sVar5,(long)free_chunk - smem_base_ptr);
  }
  else {
    GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
    ::GlobalPtr((GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                 *)&size_local,(nullptr_t)0x0);
  }
  return _size_local;
}

Assistant:

inline GlobalPtr <T> local_malloc(size_t size) {
  if (bcl_finalized) {
    return nullptr;
  }
  BCL::malloc_mutex.lock();
  size = size * sizeof(T);
  // Align size
  size = ((size + SMALLEST_MEM_UNIT - 1) / SMALLEST_MEM_UNIT) * SMALLEST_MEM_UNIT;

  chunk_t *chunk = flist;

  while (chunk != NULL) {
    if (chunk->size >= size) {
      break;
    }
    chunk = chunk->next;
  }

  char *allocd = nullptr;
  if (chunk != NULL && chunk->size >= size) {
    // I have a chunk!
    if (chunk->size > SMALLEST_MEM_UNIT + size + chunk_t_size()) {
      // Chunk is too big; carve off my piece and
      // replace it with free_chunk in the flist.
      chunk_t *free_chunk = (chunk_t *) (((char *) chunk) + chunk_t_size() + size);
      free_chunk->size = chunk->size - size - chunk_t_size();
      free_chunk->last = chunk->last;
      free_chunk->next = chunk->next;
      if (chunk->last != NULL) {
        chunk->last->next = free_chunk;
      }
      if (chunk->next != NULL) {
        chunk->next->last = free_chunk;
      }
      chunk->size = size;
      chunk->next = NULL;
      chunk->last = NULL;
      if (chunk == flist) {
        flist = free_chunk;
      }
    } else {
      // Chunk is just the right size; carve it
      // off and close the hole in the flist.
      if (chunk->last != NULL) {
        chunk->last->next = chunk->next;
      }
      if (chunk->next != NULL) {
        chunk->next->last = chunk->last;
      }
      if (chunk == flist) {
        flist = chunk->next;
      }
      chunk->last = NULL;
      chunk->next = NULL;
    }
    allocd = ((char *) chunk) + chunk_t_size();
  } else {
    // No free chunk, carve one off the heap.
    chunk = BCL::smem_heap;
    chunk->size = size;
    chunk->next = NULL;
    chunk->last = NULL;
    allocd = ((char *) chunk) + chunk_t_size();
    if (allocd + size > ((char *) BCL::smem_base_ptr) + shared_segment_size) {
      BCL::malloc_mutex.unlock();
      return nullptr;
    } else {
      BCL::smem_heap = (chunk_t *) (((char *) allocd) + size);
    }
  }

  BCL::malloc_mutex.unlock();

  return GlobalPtr <T> (BCL::rank(), (uint64_t) (allocd - (char *) BCL::smem_base_ptr));
}